

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_ghost.cpp
# Opt level: O0

RemoteGraph * Omega_h::get_own_verts2own_elems(RemoteGraph *__return_storage_ptr__,Mesh *mesh)

{
  undefined1 local_1b8 [8];
  LOs own_verts2serv_uses;
  Dist own_verts2local_uses;
  undefined1 local_f8 [8];
  Remotes serv_uses2own_elems;
  undefined1 local_c8 [8];
  Dist local_uses2own_verts;
  Remotes local_uses2own_elems;
  Mesh *mesh_local;
  
  get_local_elem_uses2own_elems
            ((Remotes *)
             &local_uses2own_verts.comm_[1].
              super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount,mesh);
  get_local_elem_uses2own_verts((Dist *)local_c8,mesh);
  Remotes::Remotes((Remotes *)
                   &own_verts2local_uses.comm_[1].
                    super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   (Remotes *)
                   &local_uses2own_verts.comm_[1].
                    super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  Dist::exch((Remotes *)local_f8,(Dist *)local_c8,
             (Remotes *)
             &own_verts2local_uses.comm_[1].
              super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount,1);
  Remotes::~Remotes((Remotes *)
                    &own_verts2local_uses.comm_[1].
                     super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  Dist::invert((Dist *)&own_verts2serv_uses.write_.shared_alloc_.direct_ptr,(Dist *)local_c8);
  Dist::roots2items((Dist *)local_1b8);
  Read<int>::Read(&__return_storage_ptr__->locals2edges,(Read<int> *)local_1b8);
  Remotes::Remotes(&__return_storage_ptr__->edges2remotes,(Remotes *)local_f8);
  Read<int>::~Read((Read<int> *)local_1b8);
  Dist::~Dist((Dist *)&own_verts2serv_uses.write_.shared_alloc_.direct_ptr);
  Remotes::~Remotes((Remotes *)local_f8);
  Dist::~Dist((Dist *)local_c8);
  Remotes::~Remotes((Remotes *)
                    &local_uses2own_verts.comm_[1].
                     super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

static RemoteGraph get_own_verts2own_elems(Mesh* mesh) {
  auto local_uses2own_elems = get_local_elem_uses2own_elems(mesh);
  auto local_uses2own_verts = get_local_elem_uses2own_verts(mesh);
  auto serv_uses2own_elems = local_uses2own_verts.exch(local_uses2own_elems, 1);
  auto own_verts2local_uses = local_uses2own_verts.invert();
  auto own_verts2serv_uses = own_verts2local_uses.roots2items();
  return {own_verts2serv_uses, serv_uses2own_elems};
}